

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O1

void tf::detail::
     parallel_pdqsort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>,false>
               (undefined8 *rt,
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               begin,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     end,int param_4,byte param_5)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  int iVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  pVar9;
  _Iter_comp_iter<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __cmp;
  int local_b0;
  DefaultTaskParams local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined8 *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  anon_class_64_6_4db4d30f local_78;
  
  local_a8 = end._M_current + -1;
  local_98 = end._M_current + -2;
  local_a0 = end._M_current + -3;
  local_b0 = param_4;
  local_90 = rt;
  do {
    lVar5 = (long)end._M_current - (long)begin._M_current;
    uVar6 = lVar5 >> 5;
    if (uVar6 < 0x18) {
      if ((param_5 & 1) == 0) {
        unguarded_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                  (begin._M_current,end._M_current);
      }
      else {
        insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                  ();
      }
LAB_00110024:
      bVar2 = true;
    }
    else {
      if (uVar6 < 0x801) {
        if (begin._M_current != end._M_current) {
          lVar5 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                    (begin._M_current,end._M_current,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                    (begin._M_current,end._M_current);
        }
        goto LAB_00110024;
      }
      uVar7 = uVar6 & 0xffffffffffffffe;
      sort3<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                (begin._M_current,&(begin._M_current)->_M_dataplus + uVar7 * 2,local_a8);
      local_80 = begin._M_current + 1;
      sort3<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                (local_80,&begin._M_current[-1]._M_dataplus + uVar7 * 2,local_98);
      local_88 = begin._M_current + 2;
      sort3<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                (local_88,&begin._M_current[1]._M_dataplus + uVar7 * 2,local_a0);
      sort3<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                (&begin._M_current[-1]._M_dataplus + uVar7 * 2,
                 &(begin._M_current)->_M_dataplus + uVar7 * 2,
                 &begin._M_current[1]._M_dataplus + uVar7 * 2);
      std::__cxx11::string::swap((string *)begin._M_current);
      if (((param_5 & 1) == 0) &&
         (iVar3 = std::__cxx11::string::compare((string *)(begin._M_current + -1)), -1 < iVar3)) {
        _Var4 = partition_left<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                          (begin._M_current,end._M_current);
        bVar2 = false;
        begin._M_current = _Var4._M_current + 1;
      }
      else {
        pVar9 = partition_right<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                          (begin._M_current,end._M_current);
        _Var4 = pVar9.first._M_current;
        uVar7 = (long)_Var4._M_current - (long)begin._M_current >> 5;
        pbVar1 = _Var4._M_current + 1;
        uVar8 = (long)end._M_current - (long)pbVar1 >> 5;
        if ((uVar7 < uVar6 >> 3) || (uVar8 < uVar6 >> 3)) {
          local_b0 = local_b0 + -1;
          if (local_b0 == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                      (begin,end,
                       (_Iter_comp_iter<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_78);
            _Var4._M_current = local_a8;
            for (; 0x20 < lVar5; lVar5 = lVar5 + -0x20) {
              std::
              __pop_heap<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                        (begin,_Var4,_Var4,
                         (_Iter_comp_iter<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_78);
              _Var4._M_current = _Var4._M_current + -1;
            }
            local_b0 = 0;
            bVar2 = true;
            goto LAB_00110027;
          }
          if (0x17 < uVar7) {
            std::__cxx11::string::swap((string *)begin._M_current);
            std::__cxx11::string::swap((string *)(_Var4._M_current + -1));
            if (0x80 < uVar7) {
              std::__cxx11::string::swap((string *)local_80);
              std::__cxx11::string::swap((string *)local_88);
              std::__cxx11::string::swap((string *)(_Var4._M_current + -2));
              std::__cxx11::string::swap((string *)(_Var4._M_current + -3));
            }
          }
          if (0x17 < uVar8) {
            std::__cxx11::string::swap((string *)pbVar1);
            std::__cxx11::string::swap((string *)local_a8);
            if (0x80 < uVar8) {
              std::__cxx11::string::swap((string *)(_Var4._M_current + 2));
              std::__cxx11::string::swap((string *)(_Var4._M_current + 3));
              std::__cxx11::string::swap((string *)local_98);
              std::__cxx11::string::swap((string *)local_a0);
            }
          }
        }
        else if (((((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
                 (bVar2 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                                    (begin._M_current,_Var4._M_current), bVar2)) &&
                (bVar2 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                                   (pbVar1,end._M_current), bVar2)) goto LAB_00110024;
        local_78.rt._executor = (Executor *)*local_90;
        local_78.rt._17_8_ = *(undefined8 *)((long)local_90 + 0x11);
        local_78.rt._parent._0_1_ = (undefined1)((ulong)*(undefined8 *)((long)local_90 + 9) >> 0x38)
        ;
        local_78.rt._worker._0_1_ = (undefined1)local_90[1];
        local_78.rt._worker._1_7_ = (undefined7)((ulong)local_90[1] >> 8);
        local_78.bad_allowed = local_b0;
        local_78.leftmost = (bool)(param_5 & 1);
        LOCK();
        *(long *)(local_90[2] + 0x80) = *(long *)(local_90[2] + 0x80) + 1;
        UNLOCK();
        local_78.begin._M_current = begin._M_current;
        local_78.pivot_pos._M_current = _Var4._M_current;
        Executor::
        _silent_async<tf::DefaultTaskParams,tf::detail::parallel_pdqsort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>,false>(tf::Runtime&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>,int,bool)::_lambda()_1_>
                  ((Executor *)*local_90,&local_a9,&local_78,((Node *)local_90[2])->_topology,
                   (Node *)local_90[2]);
        bVar2 = false;
        param_5 = 0;
        begin._M_current = pbVar1;
      }
    }
LAB_00110027:
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void parallel_pdqsort(
  Runtime& rt,
  Iter begin, Iter end, Compare comp,
  int bad_allowed, bool leftmost = true
) {

  // Partitions below this size are sorted sequentially
  constexpr auto cutoff = parallel_sort_cutoff<Iter>();

  // Partitions below this size are sorted using insertion sort
  constexpr auto insertion_sort_threshold = 24;

  // Partitions above this size use Tukey's ninther to select the pivot.
  constexpr auto ninther_threshold = 128;

  //using diff_t = typename std::iterator_traits<Iter>::difference_type;

  // Use a while loop for tail recursion elimination.
  while (true) {

    //diff_t size = end - begin;
    size_t size = end - begin;

    // Insertion sort is faster for small arrays.
    if (size < insertion_sort_threshold) {
      if (leftmost) {
        insertion_sort(begin, end, comp);
      }
      else {
        unguarded_insertion_sort(begin, end, comp);
      }
      return;
    }

    if(size <= cutoff) {
      std::sort(begin, end, comp);
      return;
    }

    // Choose pivot as median of 3 or pseudomedian of 9.
    //diff_t s2 = size / 2;
    size_t s2 = size >> 1;
    if (size > ninther_threshold) {
      sort3(begin, begin + s2, end - 1, comp);
      sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
      sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
      sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
      std::iter_swap(begin, begin + s2);
    }
    else {
      sort3(begin + s2, begin, end - 1, comp);
    }

    // If *(begin - 1) is the end of the right partition
    // of a previous partition operation, there is no element in [begin, end)
    // that is smaller than *(begin - 1).
    // Then if our pivot compares equal to *(begin - 1) we change strategy,
    // putting equal elements in the left partition,
    // greater elements in the right partition.
    // We do not have to recurse on the left partition,
    // since it's sorted (all equal).
    if (!leftmost && !comp(*(begin - 1), *begin)) {
      begin = partition_left(begin, end, comp) + 1;
      continue;
    }

    // Partition and get results.
    const auto pair = Branchless ? partition_right_branchless(begin, end, comp) :
                                   partition_right(begin, end, comp);
       
    const auto pivot_pos = pair.first;
    const auto already_partitioned = pair.second;

    // Check for a highly unbalanced partition.
    //diff_t l_size = pivot_pos - begin;
    //diff_t r_size = end - (pivot_pos + 1);
    const size_t l_size = pivot_pos - begin;
    const size_t r_size = end - (pivot_pos + 1);
    const bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

    // If we got a highly unbalanced partition we shuffle elements
    // to break many patterns.
    if (highly_unbalanced) {
      // If we had too many bad partitions, switch to heapsort
      // to guarantee O(n log n).
      if (--bad_allowed == 0) {
        std::make_heap(begin, end, comp);
        std::sort_heap(begin, end, comp);
        return;
      }

      if (l_size >= insertion_sort_threshold) {
        std::iter_swap(begin, begin + l_size / 4);
        std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);
        if (l_size > ninther_threshold) {
          std::iter_swap(begin + 1, begin + (l_size / 4 + 1));
          std::iter_swap(begin + 2, begin + (l_size / 4 + 2));
          std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
          std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
        }
      }

      if (r_size >= insertion_sort_threshold) {
        std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
        std::iter_swap(end - 1,                   end - r_size / 4);
        if (r_size > ninther_threshold) {
          std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
          std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
          std::iter_swap(end - 2,             end - (1 + r_size / 4));
          std::iter_swap(end - 3,             end - (2 + r_size / 4));
        }
      }
    }
    // decently balanced
    else {
      // sequence try to use insertion sort.
      if (already_partitioned &&
          partial_insertion_sort(begin, pivot_pos, comp) &&
          partial_insertion_sort(pivot_pos + 1, end, comp)
      ) {
        return;
      }
    }

    // Sort the left partition first using recursion and
    // do tail recursion elimination for the right-hand partition.
    // here we need to copy runtime so it stays alive during the sort recursion
    rt.silent_async([=] () mutable {
      parallel_pdqsort<Iter, Compare, Branchless>(
        rt, begin, pivot_pos, comp, bad_allowed, leftmost
      );
    });
    begin = pivot_pos + 1;
    leftmost = false;
  }
}